

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O3

void NULLCIO::WriteLongConsole(longlong number,int base)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  undefined8 uVar4;
  code *pcVar5;
  uint uVar6;
  char *pcVar7;
  size_t sVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  char buf [128];
  char local_98 [128];
  
  pcVar5 = writeFunc;
  uVar4 = contextFunc;
  if (base - 2U < 0xf) {
    if (writeFunc != (code *)0x0) {
      uVar12 = (ulong)(uint)base;
      iVar10 = (int)(number % (long)uVar12);
      uVar9 = (ulong)(uint)-iVar10;
      if (0 < iVar10) {
        uVar9 = number % (long)uVar12 & 0xffffffff;
      }
      local_98[0] = "0123456789abcdef"[uVar9];
      lVar11 = number / (long)uVar12;
      pcVar3 = local_98;
      while (pcVar2 = pcVar3 + 1, lVar11 != 0) {
        iVar10 = (int)(lVar11 % (long)uVar12);
        uVar9 = (ulong)(uint)-iVar10;
        if (0 < iVar10) {
          uVar9 = lVar11 % (long)uVar12 & 0xffffffff;
        }
        *pcVar2 = "0123456789abcdef"[uVar9];
        lVar11 = lVar11 / (long)uVar12;
        pcVar3 = pcVar2;
      }
      pcVar7 = pcVar2;
      if (number < 0) {
        pcVar7 = pcVar3 + 2;
        *pcVar2 = '-';
      }
      *pcVar7 = '\0';
      uVar6 = (int)((int)pcVar7 - (uint)local_98) >> 1;
      if (0 < (int)uVar6) {
        lVar11 = (ulong)(~(uint)local_98 + (int)pcVar7) << 0x20;
        uVar9 = 0;
        do {
          cVar1 = local_98[uVar9];
          local_98[uVar9] = local_98[lVar11 >> 0x20];
          local_98[lVar11 >> 0x20] = cVar1;
          uVar9 = uVar9 + 1;
          lVar11 = lVar11 + -0x100000000;
        } while (uVar6 != uVar9);
      }
      sVar8 = strlen(local_98);
      (*pcVar5)(uVar4,local_98,sVar8 & 0xffffffff);
    }
    return;
  }
  nullcThrowError("ERROR: incorrect base %d");
  return;
}

Assistant:

void WriteLongConsole(long long number, int base)
	{
		if(!(base > 1 && base <= 16))
		{
			nullcThrowError("ERROR: incorrect base %d", base);
			return;
		}

		if(!writeFunc)
			return;

		static char symb[] = "0123456789abcdef";
		bool sign = 0;
		char buf[128];
		char *curr = buf;
		if(number < 0)
			sign = 1;

		*curr++ = *(abs(number % base) + symb);
		while(number /= base)
			*curr++ = *(abs(number % base) + symb);
		if(sign)
			*curr++ = '-';
		*curr = 0;
		int size = int(curr - buf), halfsize = size >> 1;
		for(int i = 0; i < halfsize; i++)
		{
			char tmp = buf[i];
			buf[i] = buf[size-i-1];
			buf[size-i-1] = tmp;
		}

		writeFunc(contextFunc, buf, (unsigned)strlen(buf));
	}